

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<32,_151>::CompactCorrelationMatrix::verifySize
               (uint ni,uint nj,uint nc)

{
  undefined8 *puVar1;
  
  if ((ni == nj) && (ni == nc)) {
    return;
  }
  tools::Log::error<char_const*>("Encountered inconsistent number of i, j and correlation values");
  tools::Log::info<char_const*,unsigned_int>("i.size(): {}",ni);
  tools::Log::info<char_const*,unsigned_int>("j.size(): {}",nj);
  tools::Log::info<char_const*,unsigned_int>("correlations.size(): {}",nc);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( unsigned int ni, unsigned int nj, unsigned int nc ) {

  if ( !( ( ni == nj ) && ( ni == nc ) ) ) {

    Log::error( "Encountered inconsistent number of i, j and correlation values" );
    Log::info( "i.size(): {}", ni );
    Log::info( "j.size(): {}", nj );
    Log::info( "correlations.size(): {}", nc );
    throw std::exception();
  }
}